

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

int gauden_invert_variance(gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vector_t pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar1 = g->n_mgau;
  if ((ulong)uVar1 != 0) {
    uVar2 = g->n_feat;
    uVar6 = 0;
    do {
      if ((ulong)uVar2 != 0) {
        uVar3 = g->n_density;
        uVar8 = 0;
        do {
          if ((ulong)uVar3 != 0) {
            uVar4 = g->veclen[uVar8];
            uVar9 = 0;
            do {
              if ((ulong)uVar4 != 0) {
                pfVar5 = g->var[uVar6][uVar8][uVar9];
                uVar7 = 0;
                do {
                  pfVar5[uVar7] = 1.0 / pfVar5[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar4 != uVar7);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar3);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar2);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar1);
  }
  return 0;
}

Assistant:

int
gauden_invert_variance(gauden_t *g)
{
    uint32 i, j, k, l;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		for (l = 0; l < g->veclen[j]; l++) {
		    g->var[i][j][k][l] = 1.0 / g->var[i][j][k][l];
		}
	    }
	}
    }

    return S3_SUCCESS;
}